

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopItemFlag(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int *piVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (1 < (GImGui->ItemFlagsStack).Size) {
    ImVector<int>::pop_back(&GImGui->ItemFlagsStack);
    piVar3 = ImVector<int>::back(&pIVar2->ItemFlagsStack);
    (pIVar1->DC).ItemFlags = *piVar3;
    return;
  }
  __assert_fail("g.ItemFlagsStack.Size > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x18ec,"void ImGui::PopItemFlag()");
}

Assistant:

void ImGui::PopItemFlag()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.ItemFlagsStack.Size > 1); // Too many calls to PopItemFlag() - we always leave a 0 at the bottom of the stack.
    g.ItemFlagsStack.pop_back();
    window->DC.ItemFlags = g.ItemFlagsStack.back();
}